

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_cleanup.h
# Opt level: O0

void google::protobuf::internal::cleanup::
     arena_destruct_object<google::protobuf::internal::InternalMetadata::Container<std::__cxx11::string>>
               (void *object)

{
  void *object_local;
  
  InternalMetadata::
  Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~Container((Container<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)object);
  return;
}

Assistant:

void arena_destruct_object(void* object) {
  reinterpret_cast<T*>(object)->~T();
}